

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O0

void __thiscall QCollapsibleFrame::setTitleObjectName(QCollapsibleFrame *this,QString *name)

{
  QString *in_RDI;
  void *in_stack_00000018;
  ConnectionType in_stack_00000024;
  anon_class_32_2_3fe36446_for_function *in_stack_00000028;
  QObject *in_stack_00000030;
  QString *in_stack_ffffffffffffffc0;
  
  QString::QString(in_stack_ffffffffffffffc0,in_RDI);
  QMetaObject::
  invokeMethod<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_pasnox[P]qtwidgetsextra_qtwidgetsextra_QtWidgetsExtra_Additional_QCollapsibleFrame_cpp:269:9)>
            (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018);
  setTitleObjectName(QString_const&)::$_0::~__0((anon_class_32_2_3fe36446_for_function *)0x1f257e);
  return;
}

Assistant:

void QCollapsibleFrame::setTitleObjectName(const QString &name) {
    QMetaObject::invokeMethod(
        this,
        [this, name]() {
            if (titleObjectName() != name) {
                setTitle(findChild<QWidget *>(name));
            }
        },
        Qt::QueuedConnection);
}